

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Word.h
# Opt level: O2

void __thiscall Word::~Word(Word *this)

{
  ~Word(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~Word(){

    }